

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# monster_test_json_parser.h
# Opt level: O3

char * Fantasy_Character_parse_json_enum
                 (flatcc_json_parser_t *ctx,char *buf,char *end,int *value_sign,uint64_t *value,
                 int *aggregate)

{
  ulong uVar1;
  char *pcVar2;
  uint64_t uVar3;
  
  if ((ulong)((long)end - (long)buf) < 8) {
    uVar1 = 0;
    switch((long)end - (long)buf) {
    case 7:
      uVar1 = (long)buf[6] << 8;
    case 6:
      uVar1 = uVar1 | (long)buf[5] << 0x10;
    case 5:
      uVar1 = uVar1 | (long)buf[4] << 0x18;
    case 4:
      uVar1 = uVar1 | (long)buf[3] << 0x20;
    case 3:
      uVar1 = uVar1 | (long)buf[2] << 0x28;
    case 2:
      uVar1 = uVar1 | (long)buf[1] << 0x30;
    case 1:
      uVar1 = (ulong)(byte)*buf << 0x38 | uVar1;
      break;
    default:
      goto switchD_00113cf2_default;
    }
  }
  else {
    uVar1 = *(ulong *)buf;
    uVar1 = uVar1 >> 0x38 | (uVar1 & 0xff000000000000) >> 0x28 | (uVar1 & 0xff0000000000) >> 0x18 |
            (uVar1 & 0xff00000000) >> 8 | (uVar1 & 0xff000000) << 8 | (uVar1 & 0xff0000) << 0x18 |
            (uVar1 & 0xff00) << 0x28 | uVar1 << 0x38;
  }
  if ((uint)(uVar1 >> 0x20) < 0x4e4f4e45) {
    if (uVar1 < 0x426f6f6b46616e00) {
      if ((uVar1 & 0x7fffffffff000000) != 0x42656c6c65000000) {
        return buf;
      }
      pcVar2 = flatcc_json_parser_match_constant(ctx,buf,end,5,aggregate);
      if (pcVar2 == buf) {
        return buf;
      }
      uVar3 = 9;
    }
    else if ((uVar1 & 0x7fffffffff000000) == 0x4d754c616e000000) {
      pcVar2 = flatcc_json_parser_match_constant(ctx,buf,end,5,aggregate);
      if (pcVar2 == buf) {
        return buf;
      }
      uVar3 = 2;
    }
    else {
      if ((uVar1 & 0x7fffffffffffff00) != 0x426f6f6b46616e00) {
        return buf;
      }
      pcVar2 = flatcc_json_parser_match_constant(ctx,buf,end,7,aggregate);
      if (pcVar2 == buf) {
        return buf;
      }
      uVar3 = 10;
    }
  }
  else if (uVar1 < 0x4f74686572000000) {
    if ((uVar1 & 0x7fffffff00000000) != 0x4e4f4e4500000000) {
      return buf;
    }
    pcVar2 = flatcc_json_parser_match_constant(ctx,buf,end,4,aggregate);
    if (pcVar2 == buf) {
      return buf;
    }
    uVar3 = 0;
  }
  else if (uVar1 < 0x526170756e7a656c) {
    if ((uVar1 & 0x7fffffffff000000) != 0x4f74686572000000) {
      return buf;
    }
    pcVar2 = flatcc_json_parser_match_constant(ctx,buf,end,5,aggregate);
    if (pcVar2 == buf) {
      return buf;
    }
    uVar3 = 0xb;
  }
  else if (uVar1 >> 0x10 == 0x556e75736564) {
    pcVar2 = flatcc_json_parser_match_constant(ctx,buf,end,6,aggregate);
    if (pcVar2 == buf) {
      return buf;
    }
    uVar3 = 0xff;
  }
  else {
    if (uVar1 != 0x526170756e7a656c) {
      return buf;
    }
    pcVar2 = flatcc_json_parser_match_constant(ctx,buf,end,8,aggregate);
    if (pcVar2 == buf) {
      return buf;
    }
    uVar3 = 8;
  }
  *value = uVar3;
  *value_sign = 0;
  buf = pcVar2;
switchD_00113cf2_default:
  return buf;
}

Assistant:

static const char *Fantasy_Character_parse_json_enum(flatcc_json_parser_t *ctx, const char *buf, const char *end,
        int *value_sign, uint64_t *value, int *aggregate)
{
    const char *unmatched = buf;
    const char *mark;
    uint64_t w;

    w = flatcc_json_parser_symbol_part(buf, end);
    if (w < 0x4e4f4e4500000000) { /* branch "NONE" */
        if (w < 0x426f6f6b46616e00) { /* branch "BookFan" */
            if ((w & 0xffffffffff000000) == 0x42656c6c65000000) { /* "Belle" */
                buf = flatcc_json_parser_match_constant(ctx, (mark = buf), end, 5, aggregate);
                if (buf != mark) {
                    *value = UINT64_C(9), *value_sign = 0;
                } else {
                    return unmatched;
                }
            } else { /* "Belle" */
                return unmatched;
            } /* "Belle" */
        } else { /* branch "BookFan" */
            if ((w & 0xffffffffff000000) == 0x4d754c616e000000) { /* "MuLan" */
                buf = flatcc_json_parser_match_constant(ctx, (mark = buf), end, 5, aggregate);
                if (buf != mark) {
                    *value = UINT64_C(2), *value_sign = 0;
                } else {
                    return unmatched;
                }
            } else { /* "MuLan" */
                if ((w & 0xffffffffffffff00) == 0x426f6f6b46616e00) { /* "BookFan" */
                    buf = flatcc_json_parser_match_constant(ctx, (mark = buf), end, 7, aggregate);
                    if (buf != mark) {
                        *value = UINT64_C(10), *value_sign = 0;
                    } else {
                        return unmatched;
                    }
                } else { /* "BookFan" */
                    return unmatched;
                } /* "BookFan" */
            } /* "MuLan" */
        } /* branch "BookFan" */
    } else { /* branch "NONE" */
        if (w < 0x4f74686572000000) { /* branch "Other" */
            if ((w & 0xffffffff00000000) == 0x4e4f4e4500000000) { /* "NONE" */
                buf = flatcc_json_parser_match_constant(ctx, (mark = buf), end, 4, aggregate);
                if (buf != mark) {
                    *value = UINT64_C(0), *value_sign = 0;
                } else {
                    return unmatched;
                }
            } else { /* "NONE" */
                return unmatched;
            } /* "NONE" */
        } else { /* branch "Other" */
            if (w < 0x526170756e7a656c) { /* branch "Rapunzel" */
                if ((w & 0xffffffffff000000) == 0x4f74686572000000) { /* "Other" */
                    buf = flatcc_json_parser_match_constant(ctx, (mark = buf), end, 5, aggregate);
                    if (buf != mark) {
                        *value = UINT64_C(11), *value_sign = 0;
                    } else {
                        return unmatched;
                    }
                } else { /* "Other" */
                    return unmatched;
                } /* "Other" */
            } else { /* branch "Rapunzel" */
                if ((w & 0xffffffffffff0000) == 0x556e757365640000) { /* "Unused" */
                    buf = flatcc_json_parser_match_constant(ctx, (mark = buf), end, 6, aggregate);
                    if (buf != mark) {
                        *value = UINT64_C(255), *value_sign = 0;
                    } else {
                        return unmatched;
                    }
                } else { /* "Unused" */
                    if (w == 0x526170756e7a656c) { /* "Rapunzel" */
                        buf = flatcc_json_parser_match_constant(ctx, (mark = buf), end, 8, aggregate);
                        if (buf != mark) {
                            *value = UINT64_C(8), *value_sign = 0;
                        } else {
                            return unmatched;
                        }
                    } else { /* "Rapunzel" */
                        return unmatched;
                    } /* "Rapunzel" */
                } /* "Unused" */
            } /* branch "Rapunzel" */
        } /* branch "Other" */
    } /* branch "NONE" */
    return buf;
}